

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[48],kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&,kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [48],
               DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
               *params_1,TestObject **params_2,TestObject **params_3)

{
  undefined4 in_register_00000014;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  *params_00;
  TestObject **params_01;
  TestObject **params_02;
  long lVar1;
  undefined4 in_register_00000034;
  String argValues [4];
  
  str<char_const(&)[48]>
            (argValues,(kj *)"failed: expected (arr1.end()) <= (arr2.begin())",
             (char (*) [48])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&>
            (argValues + 1,(kj *)CONCAT44(in_register_00000034,line),params_00);
  str<kj::(anonymous_namespace)::TestObject*&>
            (argValues + 2,(kj *)CONCAT44(in_register_00000014,severity),params_01);
  str<kj::(anonymous_namespace)::TestObject*&>(argValues + 3,(kj *)macroArgs,params_02);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,0x4009c6,(char *)argValues,
              (ArrayPtr<kj::String>)argValues[0].content._0_16_);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}